

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csvmodelserialiser.cpp
# Opt level: O1

bool __thiscall CsvModelSerialiser::loadModel(CsvModelSerialiser *this,QString *source)

{
  CsvModelSerialiserPrivate *this_00;
  bool bVar1;
  QTextStream reader;
  QTextStream local_20 [16];
  
  if ((source == (QString *)0x0) ||
     (this_00 = (CsvModelSerialiserPrivate *)
                (this->super_AbstractSingleRoleSerialiser).super_AbstractStringSerialiser.
                super_AbstractModelSerialiser.d_ptr.d,
     (this_00->super_AbstractSingleRoleSerialiserPrivate).super_AbstractStringSerialiserPrivate.
     super_AbstractModelSerialiserPrivate.m_model == (QAbstractItemModel *)0x0)) {
    bVar1 = false;
  }
  else {
    QTextStream::QTextStream(local_20,source,0x11);
    bVar1 = CsvModelSerialiserPrivate::readCsv(this_00,local_20);
    QTextStream::~QTextStream(local_20);
  }
  return bVar1;
}

Assistant:

bool CsvModelSerialiser::loadModel(QString *source)
{
    if (!source)
        return false;
    Q_D(CsvModelSerialiser);

    if (!d->m_model)
        return false;
    QTextStream reader(source, QIODevice::ReadOnly | QIODevice::Text);
#if (QT_VERSION < QT_VERSION_CHECK(6, 0, 0))
    reader.setCodec(textCodec());
#endif
    return d->readCsv(reader);
}